

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

void QCoreApplication::exit(int __status)

{
  QObjectData *pQVar1;
  QObject *pQVar2;
  qsizetype i;
  _func_int **pp_Var3;
  
  if (self != (QCoreApplication *)0x0) {
    pQVar1 = (self->super_QObject).d_ptr.d;
    if (*(char *)((long)&pQVar1[1].bindingStorage.d + 2) == '\0') {
      aboutToQuit();
      *(undefined1 *)((long)&pQVar1[1].bindingStorage.d + 2) = 1;
    }
    pQVar2 = pQVar1[1].q_ptr;
    *(undefined1 *)((long)&pQVar2[8].d_ptr.d + 4) = 1;
    for (pp_Var3 = (_func_int **)0x0; pp_Var3 < pQVar2[1]._vptr_QObject;
        pp_Var3 = (_func_int **)((long)pp_Var3 + 1)) {
      QEventLoop::exit((QEventLoop *)(&((pQVar2->d_ptr).d)->_vptr_QObjectData)[(long)pp_Var3],
                       __status);
    }
  }
  return;
}

Assistant:

void QCoreApplication::exit(int returnCode)
{
    if (!self)
        return;
    QCoreApplicationPrivate *d = self->d_func();
    if (!d->aboutToQuitEmitted) {
        emit self->aboutToQuit(QCoreApplication::QPrivateSignal());
        d->aboutToQuitEmitted = true;
    }
    QThreadData *data = d->threadData.loadRelaxed();
    data->quitNow = true;
    for (qsizetype i = 0; i < data->eventLoops.size(); ++i) {
        QEventLoop *eventLoop = data->eventLoops.at(i);
        eventLoop->exit(returnCode);
    }
}